

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.c
# Opt level: O2

void LzmaEnc_Init(CLzmaEnc *p)

{
  uint uVar1;
  uint uVar2;
  UInt16 *pUVar3;
  long lVar4;
  UInt16 (*paUVar5) [16];
  UInt16 (*paUVar6) [64];
  UInt32 j_1;
  ulong uVar7;
  UInt32 j;
  long lVar8;
  
  p->state = 0;
  for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
    p->reps[lVar4] = 0;
  }
  RangeEnc_Init(&p->rc);
  paUVar5 = p->isRep0Long;
  for (lVar4 = 0; lVar4 != 0xc; lVar4 = lVar4 + 1) {
    for (lVar8 = 0; lVar8 != 0x10; lVar8 = lVar8 + 1) {
      paUVar5[-0xf][lVar8] = 0x400;
      (*paUVar5)[lVar8] = 0x400;
    }
    p->isRep[lVar4] = 0x400;
    p->isRepG0[lVar4] = 0x400;
    p->isRepG1[lVar4] = 0x400;
    p->isRepG2[lVar4] = 0x400;
    paUVar5 = paUVar5 + 1;
  }
  uVar1 = p->lc;
  uVar2 = p->lp;
  pUVar3 = p->litProbs;
  for (uVar7 = 0; (uint)(0x300 << ((char)uVar1 + (char)uVar2 & 0x1fU)) != uVar7; uVar7 = uVar7 + 1)
  {
    pUVar3[uVar7] = 0x400;
  }
  paUVar6 = p->posSlotEncoder;
  for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
    for (lVar8 = 0; lVar8 != 0x40; lVar8 = lVar8 + 1) {
      (*paUVar6)[lVar8] = 0x400;
    }
    paUVar6 = paUVar6 + 1;
  }
  for (lVar4 = 0; lVar4 != 0x72; lVar4 = lVar4 + 1) {
    p->posEncoders[lVar4] = 0x400;
  }
  LenEnc_Init(&(p->lenEnc).p);
  LenEnc_Init(&(p->repLenEnc).p);
  for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
    p->posAlignEncoder[lVar4] = 0x400;
  }
  p->optimumEndIndex = 0;
  p->optimumCurrentIndex = 0;
  p->additionalOffset = 0;
  p->pbMask = ~(-1 << ((byte)p->pb & 0x1f));
  p->lpMask = ~(-1 << ((byte)p->lp & 0x1f));
  return;
}

Assistant:

void LzmaEnc_Init(CLzmaEnc *p)
{
  UInt32 i;
  p->state = 0;
  for (i = 0 ; i < LZMA_NUM_REPS; i++)
    p->reps[i] = 0;

  RangeEnc_Init(&p->rc);


  for (i = 0; i < kNumStates; i++)
  {
    UInt32 j;
    for (j = 0; j < LZMA_NUM_PB_STATES_MAX; j++)
    {
      p->isMatch[i][j] = kProbInitValue;
      p->isRep0Long[i][j] = kProbInitValue;
    }
    p->isRep[i] = kProbInitValue;
    p->isRepG0[i] = kProbInitValue;
    p->isRepG1[i] = kProbInitValue;
    p->isRepG2[i] = kProbInitValue;
  }

  {
    UInt32 num = (UInt32)0x300 << (p->lp + p->lc);
    CLzmaProb *probs = p->litProbs;
    for (i = 0; i < num; i++)
      probs[i] = kProbInitValue;
  }

  {
    for (i = 0; i < kNumLenToPosStates; i++)
    {
      CLzmaProb *probs = p->posSlotEncoder[i];
      UInt32 j;
      for (j = 0; j < (1 << kNumPosSlotBits); j++)
        probs[j] = kProbInitValue;
    }
  }
  {
    for (i = 0; i < kNumFullDistances - kEndPosModelIndex; i++)
      p->posEncoders[i] = kProbInitValue;
  }

  LenEnc_Init(&p->lenEnc.p);
  LenEnc_Init(&p->repLenEnc.p);

  for (i = 0; i < (1 << kNumAlignBits); i++)
    p->posAlignEncoder[i] = kProbInitValue;

  p->optimumEndIndex = 0;
  p->optimumCurrentIndex = 0;
  p->additionalOffset = 0;

  p->pbMask = (1 << p->pb) - 1;
  p->lpMask = (1 << p->lp) - 1;
}